

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.h
# Opt level: O0

void __thiscall moira::Debugger::Debugger(Debugger *this,Moira *ref)

{
  Moira *ref_local;
  Debugger *this_local;
  
  this->moira = ref;
  Breakpoints::Breakpoints(&this->breakpoints,this->moira);
  Watchpoints::Watchpoints(&this->watchpoints,this->moira);
  Catchpoints::Catchpoints(&this->catchpoints,this->moira);
  SoftwareTraps::SoftwareTraps(&this->swTraps);
  std::optional<long_long>::optional(&this->softStop);
  this->logCnt = 0;
  return;
}

Assistant:

Debugger(Moira& ref) : moira(ref) { }